

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_send(mg_connection *nc,void *buf,int len)

{
  double dVar1;
  int len_local;
  void *buf_local;
  mg_connection *nc_local;
  
  dVar1 = mg_time();
  nc->last_io_time = (long)dVar1;
  if ((nc->flags & 2) == 0) {
    mg_if_tcp_send(nc,buf,(long)len);
  }
  else {
    mg_if_udp_send(nc,buf,(long)len);
  }
  if ((nc->mgr != (mg_mgr *)0x0) && (nc->mgr->hexdump_file != (char *)0x0)) {
    mg_hexdump_connection(nc,nc->mgr->hexdump_file,buf,len,4);
  }
  return;
}

Assistant:

void mg_send(struct mg_connection *nc, const void *buf, int len) {
    nc->last_io_time = mg_time();
    if (nc->flags & MG_F_UDP) {
        mg_if_udp_send(nc, buf, len);
    } else {
        mg_if_tcp_send(nc, buf, len);
    }
#if !defined(NO_LIBC) && !defined(MG_DISABLE_HEXDUMP)
    if (nc->mgr && nc->mgr->hexdump_file != NULL) {
        mg_hexdump_connection(nc, nc->mgr->hexdump_file, buf, len, MG_EV_SEND);
    }
#endif
}